

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.h
# Opt level: O0

void __thiscall lab_employees::lab_employees(lab_employees *this,Person *person,char *Subject)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *Subject_local;
  Person *person_local;
  lab_employees *this_local;
  
  Person::Person(&this->super_Person);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_CheckPassword_00109d30;
  uVar2 = Person::getId(person);
  (this->super_Person).id = uVar2;
  pcVar3 = Person::getName(person);
  (this->super_Person).name = pcVar3;
  pcVar3 = Person::getSurname(person);
  (this->super_Person).surname = pcVar3;
  bVar1 = Person::getGender(person);
  (this->super_Person).gender = bVar1;
  uVar2 = Person::getAge(person);
  (this->super_Person).age = uVar2;
  (this->super_Person).subject = Subject;
  (this->super_Person).access_level = 2;
  return;
}

Assistant:

lab_employees(Person *person,char* Subject) {
        this->id = person->getId();
        this->name = person->getName();
        this->surname = person->getSurname();
        this->gender = person->getGender();
        this->age = person->getAge();
        this->subject = Subject;
        this->access_level = 2;
    }